

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O1

void __thiscall TestSchema::buildSchema(TestSchema *this)

{
  Node *pNVar1;
  bool caught;
  undefined8 **local_1c8;
  undefined1 local_1c0;
  undefined8 *local_1b8;
  RecordSchema *local_1b0;
  undefined1 local_1a1;
  undefined **local_1a0;
  undefined1 local_198;
  undefined8 *local_190;
  FixedSchema *local_188;
  RecordSchema record;
  EnumSchema myenum;
  UnionSchema onion;
  string s;
  RecordSchema nestedRecord;
  assertion_result local_e8;
  FixedSchema fixed;
  MapSchema map;
  IntSchema intSchema;
  ArraySchema array;
  undefined1 *local_70;
  bool *local_68;
  const_string local_60;
  lazy_ostream local_50;
  undefined8 *local_40;
  char *local_38;
  
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"RootRecord","");
  avro::RecordSchema::RecordSchema(&record,(string *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"mylong","");
  pNVar1 = (Node *)operator_new(0x18);
  *(undefined4 *)(pNVar1 + 8) = 3;
  pNVar1[0xc] = (Node)0x0;
  *(code **)pNVar1 = std::_Rb_tree_insert_and_rebalance;
  avro::Schema::Schema((Schema *)&local_1a0,pNVar1);
  local_1a0 = &PTR__Schema_001d9430;
  avro::RecordSchema::addField((string *)&record,(Schema *)&local_1c8);
  avro::Schema::~Schema((Schema *)&local_1a0);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  pNVar1 = (Node *)operator_new(0x18);
  *(undefined4 *)(pNVar1 + 8) = 2;
  pNVar1[0xc] = (Node)0x0;
  *(code **)pNVar1 = std::_Rb_tree_insert_and_rebalance;
  avro::Schema::Schema(&intSchema.super_Schema,pNVar1);
  intSchema._0_8_ = &PTR__Schema_001d99c0;
  pNVar1 = (Node *)operator_new(0x18);
  *(undefined4 *)(pNVar1 + 8) = 2;
  pNVar1[0xc] = (Node)0x0;
  *(code **)pNVar1 = std::_Rb_tree_insert_and_rebalance;
  avro::Schema::Schema((Schema *)&local_1c8,pNVar1);
  local_1c8 = (undefined8 **)&PTR__Schema_001d99c0;
  avro::MapSchema::MapSchema(&map,(Schema *)&local_1c8);
  avro::Schema::~Schema((Schema *)&local_1c8);
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"mymap","");
  avro::RecordSchema::addField((string *)&record,(Schema *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  pNVar1 = (Node *)operator_new(0x18);
  *(undefined4 *)(pNVar1 + 8) = 5;
  pNVar1[0xc] = (Node)0x0;
  *(code **)pNVar1 = std::_Rb_tree_insert_and_rebalance;
  avro::Schema::Schema((Schema *)&local_1c8,pNVar1);
  local_1c8 = (undefined8 **)&PTR__Schema_001d99f8;
  avro::ArraySchema::ArraySchema(&array,(Schema *)&local_1c8);
  avro::Schema::~Schema((Schema *)&local_1c8);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&s,"myarray","");
  avro::RecordSchema::addField((string *)&record,(Schema *)&s);
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"ExampleEnum","");
  avro::EnumSchema::EnumSchema(&myenum,(string *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"zero","");
  avro::EnumSchema::addSymbol((string *)&myenum);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"one","");
  avro::EnumSchema::addSymbol((string *)&myenum);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"two","");
  avro::EnumSchema::addSymbol((string *)&myenum);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"three","");
  avro::EnumSchema::addSymbol((string *)&myenum);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  caught = false;
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"three","");
  avro::EnumSchema::addSymbol((string *)&myenum);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1dd9a0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b7ac5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x62;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001d9388;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  _fixed = &local_60;
  local_60.m_begin = (iterator)CONCAT71(local_60.m_begin._1_7_,1);
  _nestedRecord = &caught;
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)caught;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  _onion = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_1b0 = &nestedRecord;
  local_1c0 = 0;
  local_1c8 = (undefined8 **)&PTR__lazy_ostream_001d9a30;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_188 = &fixed;
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_001d9a30;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_50,(const_string *)&onion,0x62,CHECK,CHECK_EQUAL,2,"caught",
             (string *)&local_1c8,"true",(Schema *)&local_1a0);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"myenum","");
  avro::RecordSchema::addField((string *)&record,(Schema *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  avro::UnionSchema::UnionSchema(&onion);
  pNVar1 = (Node *)operator_new(0x18);
  *(undefined4 *)(pNVar1 + 8) = 7;
  pNVar1[0xc] = (Node)0x0;
  *(code **)pNVar1 = std::_Rb_tree_insert_and_rebalance;
  avro::Schema::Schema((Schema *)&local_1c8,pNVar1);
  local_1c8 = (undefined8 **)&PTR__Schema_001d9a70;
  avro::UnionSchema::addType((Schema *)&onion);
  avro::Schema::~Schema((Schema *)&local_1c8);
  avro::UnionSchema::addType((Schema *)&onion);
  pNVar1 = (Node *)operator_new(0x18);
  *(undefined4 *)(pNVar1 + 8) = 4;
  pNVar1[0xc] = (Node)0x0;
  *(code **)pNVar1 = std::_Rb_tree_insert_and_rebalance;
  avro::Schema::Schema((Schema *)&local_1c8,pNVar1);
  local_1c8 = (undefined8 **)&PTR__Schema_001d9aa8;
  avro::UnionSchema::addType((Schema *)&onion);
  avro::Schema::~Schema((Schema *)&local_1c8);
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"myunion","");
  avro::RecordSchema::addField((string *)&record,(Schema *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"NestedRecord","");
  avro::RecordSchema::RecordSchema(&nestedRecord,(string *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"floatInNested","");
  pNVar1 = (Node *)operator_new(0x18);
  *(undefined4 *)(pNVar1 + 8) = 4;
  pNVar1[0xc] = (Node)0x0;
  *(code **)pNVar1 = std::_Rb_tree_insert_and_rebalance;
  avro::Schema::Schema((Schema *)&local_1a0,pNVar1);
  local_1a0 = &PTR__Schema_001d9aa8;
  avro::RecordSchema::addField((string *)&nestedRecord,(Schema *)&local_1c8);
  avro::Schema::~Schema((Schema *)&local_1a0);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"nested","");
  avro::RecordSchema::addField((string *)&record,(Schema *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"mybool","");
  pNVar1 = (Node *)operator_new(0x18);
  *(undefined4 *)(pNVar1 + 8) = 6;
  pNVar1[0xc] = (Node)0x0;
  *(code **)pNVar1 = std::_Rb_tree_insert_and_rebalance;
  avro::Schema::Schema((Schema *)&local_1a0,pNVar1);
  local_1a0 = &PTR__Schema_001d9ae0;
  avro::RecordSchema::addField((string *)&record,(Schema *)&local_1c8);
  avro::Schema::~Schema((Schema *)&local_1a0);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"fixed16","");
  avro::FixedSchema::FixedSchema(&fixed,0x10,(string *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"myfixed","");
  avro::RecordSchema::addField((string *)&record,(Schema *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  caught = false;
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"mylong","");
  pNVar1 = (Node *)operator_new(0x18);
  *(undefined4 *)(pNVar1 + 8) = 3;
  pNVar1[0xc] = (Node)0x0;
  *(code **)pNVar1 = std::_Rb_tree_insert_and_rebalance;
  avro::Schema::Schema((Schema *)&local_1a0,pNVar1);
  local_1a0 = &PTR__Schema_001d9430;
  avro::RecordSchema::addField((string *)&record,(Schema *)&local_1c8);
  avro::Schema::~Schema((Schema *)&local_1a0);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1dd9a0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b7ac5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x7e;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001d9388;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_70 = &local_1a1;
  local_1a1 = 1;
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)caught;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_60.m_end = "";
  local_1b0 = (RecordSchema *)&local_68;
  local_68 = &caught;
  local_1c0 = 0;
  local_1c8 = (undefined8 **)&PTR__lazy_ostream_001d9a30;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_188 = (FixedSchema *)&local_70;
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_001d9a30;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_50,&local_60,0x7e,CHECK,CHECK_EQUAL,2,"caught",(string *)&local_1c8,
             "true",(Schema *)&local_1a0);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"mylong2","");
  pNVar1 = (Node *)operator_new(0x18);
  *(undefined4 *)(pNVar1 + 8) = 3;
  pNVar1[0xc] = (Node)0x0;
  *(code **)pNVar1 = std::_Rb_tree_insert_and_rebalance;
  avro::Schema::Schema((Schema *)&local_1a0,pNVar1);
  local_1a0 = &PTR__Schema_001d9430;
  avro::RecordSchema::addField((string *)&record,(Schema *)&local_1c8);
  avro::Schema::~Schema((Schema *)&local_1a0);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"anotherint","");
  avro::RecordSchema::addField((string *)&record,(Schema *)&local_1c8);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(long)local_1b8 + 1);
  }
  avro::ValidSchema::setSchema((Schema *)this);
  avro::Schema::~Schema((Schema *)&fixed);
  avro::Schema::~Schema((Schema *)&nestedRecord);
  avro::Schema::~Schema((Schema *)&onion);
  avro::Schema::~Schema((Schema *)&myenum);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p,s.field_2._M_allocated_capacity + 1);
  }
  avro::Schema::~Schema((Schema *)&array);
  avro::Schema::~Schema((Schema *)&map);
  avro::Schema::~Schema(&intSchema.super_Schema);
  avro::Schema::~Schema((Schema *)&record);
  return;
}

Assistant:

void buildSchema()
    {
        RecordSchema record("RootRecord");

        record.addField("mylong", LongSchema());

        IntSchema intSchema;
        avro::MapSchema map = MapSchema(IntSchema());

        record.addField("mymap", map);

        ArraySchema array = ArraySchema(DoubleSchema());

        const std::string s("myarray");
        record.addField(s, array);

        EnumSchema myenum("ExampleEnum");
        myenum.addSymbol("zero");
        myenum.addSymbol("one");
        myenum.addSymbol("two");
        myenum.addSymbol("three");

        bool caught = false;
        try {
            myenum.addSymbol("three");
        }
        catch(Exception &e) {
            std::cout << "(intentional) exception: " << e.what() << '\n';
            caught = true;
        }
        BOOST_CHECK_EQUAL(caught, true);

        record.addField("myenum", myenum); 

        UnionSchema onion;
        onion.addType(NullSchema());
        onion.addType(map);
        onion.addType(FloatSchema());
       
        record.addField("myunion", onion); 

        RecordSchema nestedRecord("NestedRecord");
        nestedRecord.addField("floatInNested", FloatSchema());

        record.addField("nested", nestedRecord);

        record.addField("mybool", BoolSchema());
        FixedSchema fixed(16, "fixed16");
        record.addField("myfixed", fixed);

        caught = false;
        try {
            record.addField("mylong", LongSchema());
        }
        catch(Exception &e) {
            std::cout << "(intentional) exception: " << e.what() << '\n';
            caught = true;
        }
        BOOST_CHECK_EQUAL(caught, true);

        record.addField("mylong2", LongSchema());

        record.addField("anotherint", intSchema);

        schema_.setSchema(record);
    }